

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pull_by_name.c
# Opt level: O1

int ks_getuntil2(kstream_t *ks,int delimiter,kstring_t *str,int *dret,int append)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  size_t sVar4;
  ushort **ppuVar5;
  ulong uVar6;
  char *pcVar7;
  long lVar8;
  size_t __size;
  int iVar9;
  int iVar10;
  long lVar11;
  uchar *puVar12;
  byte *pbVar13;
  
  if (dret != (int *)0x0) {
    *dret = 0;
  }
  bVar3 = false;
  if (append == 0) {
    sVar4 = 0;
  }
  else {
    sVar4 = str->l;
  }
  str->l = sVar4;
  do {
    if (ks->begin < ks->end) {
LAB_00104eed:
      iVar9 = ks->begin;
      iVar1 = ks->end;
      iVar10 = iVar9;
      if (delimiter == 0) {
        if (iVar9 < iVar1) {
          ppuVar5 = __ctype_b_loc();
          pbVar13 = ks->buf + iVar9;
          do {
            iVar10 = iVar9;
            if ((*(byte *)((long)*ppuVar5 + (ulong)*pbVar13 * 2 + 1) & 0x20) != 0) break;
            iVar9 = iVar9 + 1;
            pbVar13 = pbVar13 + 1;
            iVar10 = iVar1;
          } while (iVar1 != iVar9);
        }
      }
      else if (delimiter == 2) {
        if (iVar9 < iVar1) {
          puVar12 = ks->buf + iVar9;
          do {
            iVar10 = iVar9;
            if (*puVar12 == '\n') break;
            iVar9 = iVar9 + 1;
            puVar12 = puVar12 + 1;
            iVar10 = iVar1;
          } while (iVar1 != iVar9);
        }
      }
      else if (iVar9 < iVar1) {
        ppuVar5 = __ctype_b_loc();
        pbVar13 = ks->buf + iVar9;
        do {
          if ((*pbVar13 != 0x20) && (iVar10 = iVar9, ((*ppuVar5)[*pbVar13] & 0x2000) != 0)) break;
          iVar9 = iVar9 + 1;
          pbVar13 = pbVar13 + 1;
          iVar10 = iVar1;
        } while (iVar1 != iVar9);
      }
      lVar11 = (long)iVar10;
      lVar8 = lVar11 - ks->begin;
      if (str->m - str->l < lVar8 + 1U) {
        uVar6 = str->l + (long)(int)lVar8;
        uVar6 = uVar6 >> 1 | uVar6;
        uVar6 = uVar6 >> 2 | uVar6;
        uVar6 = uVar6 >> 4 | uVar6;
        uVar6 = uVar6 >> 8 | uVar6;
        __size = (uVar6 >> 0x10 | uVar6) + 1;
        str->m = __size;
        pcVar7 = (char *)realloc(str->s,__size);
        str->s = pcVar7;
      }
      memcpy(str->s + str->l,ks->buf + ks->begin,lVar11 - ks->begin);
      str->l = str->l + (lVar11 - ks->begin);
      bVar2 = ks->end <= iVar10;
      ks->begin = iVar10 + 1;
      bVar3 = true;
      if ((dret != (int *)0x0) && (iVar10 < ks->end)) {
        *dret = (uint)ks->buf[lVar11];
        goto LAB_00105083;
      }
    }
    else {
      if (ks->is_eof == 0) {
        ks->begin = 0;
        iVar9 = gzread(ks->f,ks->buf,0xffff);
        ks->end = iVar9;
        if (iVar9 != 0) goto LAB_00104eed;
        ks->is_eof = 1;
      }
LAB_00105083:
      bVar2 = false;
    }
    if (!bVar2) {
      if (((bVar3) || (ks->is_eof == 0)) || (iVar9 = -1, ks->begin < ks->end)) {
        if (str->s == (char *)0x0) {
          str->m = 1;
          pcVar7 = (char *)calloc(1,1);
          str->s = pcVar7;
        }
        else if (((delimiter == 2) && (uVar6 = str->l, 1 < uVar6)) && (str->s[uVar6 - 1] == '\r')) {
          str->l = uVar6 - 1;
        }
        str->s[str->l] = '\0';
        iVar9 = (int)str->l;
      }
      return iVar9;
    }
  } while( true );
}

Assistant:

__KSEQ_READ(static)

/*
extern char const *progname;
extern int verbose_flag;
*/

int pull_by_name(char *input_file, FILE *names_fp, int min, int max, int length, int exclude, int convert, int just_count) {
	gzFile fp;
	int i,l,capacity=80;
	int count=0,excluded=0;
	int is_fasta = -1;
	char *fasta_name;
	char *line;
	kseq_t *seq;

	/* get some space for the line */
	line = malloc(sizeof(char) * capacity); /* get memory allocated */
	if (!line) {
		fprintf(stderr, "%s - line malloc: %s\n",progname, strerror(errno));
		exit(EXIT_FAILURE);
	}

	while((i = getl(&line, names_fp)) != -1) {
		fasta_name = parse_name(line);
		if (fasta_name) {
			add_name(fasta_name);             /* add fasta_name to hash */
		}
	}

	free(line); /* free up line */

	if (verbose_flag) {
		fprintf(stderr,"\n");
		fprintf(stderr,"done reading from input (%d entries)\n", hash_key_count());
	}
	/*print_hash();*/


	/* open fasta file */
	fp = gzopen(input_file,"r");
	if (!fp) {
		fprintf(stderr,"%s - Couldn't open fasta file %s\n",progname,input_file);
		exit(EXIT_FAILURE);
	}

	seq = kseq_init(fp); /* initialize kseq */

	/* determine file type */
	l = kseq_read(seq); /* read the first sequence */
	is_fasta = seq->qual.s == NULL ? 1 : 0;
	gzrewind(fp); /* rewind to beginning for main loop */
	kseq_rewind(seq);

	if (verbose_flag) {
		if (is_fasta)
			fprintf(stderr, "Input is FASTA format\n");
		else
			fprintf(stderr, "Input is FASTQ format\n");
	}

	/* search through list and see if this header matches */
	while((l = kseq_read(seq)) >= 0) {
		if (exclude == 0) { /* INCLUDE names from names file */
			if (find_name(seq->name.s))            /* found name in list */
				count += size_filter(seq, is_fasta, min, max, length, convert, just_count);
			else
				excluded++;
		} else { /* EXCLUDE names from names file */
			if (find_name(seq->name.s))            /* found name in list */
				excluded++;
			else
				count += size_filter(seq, is_fasta, min, max, length, convert, just_count);
		}
	}
	kseq_destroy(seq);
	gzclose(fp); /* done reading file */

	delete_hash(); /* free the list nodes */

	if (just_count) {
		fprintf(stdout, "Total output: %i\n", count);
		if (exclude)
			fprintf(stdout, "Total excluded: %i\n", excluded);
	}

	if (verbose_flag) {
		fprintf(stderr,"Processed %i entries\n",count);
		if (exclude)
			fprintf(stderr,"Excluded %i entries\n",excluded);
	}
	return count;
}